

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionCheck.cpp
# Opt level: O3

void __thiscall
AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
          (AutoNestedHandledExceptionType *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint *puVar4;
  undefined4 *puVar5;
  
  puVar4 = (uint *)__tls_get_addr(&PTR_01548e00);
  BVar3 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
  if ((BVar3 != 0) && ((char)((*puVar4 & 4) >> 2) == '\0' && *puVar4 != 8)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                       ,0x65,
                       "(ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe || (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException)"
                       ,
                       "ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe || (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  *puVar4 = 0;
  ExceptionCheck::Restore(&this->savedData);
  return;
}

Assistant:

AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType()
{
    Assert(ExceptionCheck::GetData().handledExceptionType == ExceptionType_DisableCheck ||
        !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() ||
        ExceptionCheck::GetData().handledExceptionType == ExceptionType_HasStackProbe ||
        (ExceptionCheck::GetData().handledExceptionType & ExceptionType_JavascriptException) == ExceptionType_JavascriptException);
    ExceptionCheck::ClearHandledExceptionType();
    ExceptionCheck::Restore(savedData);
}